

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

int __thiscall
soplex::SPxFastRT<double>::minSelect
          (SPxFastRT<double> *this,double *val,double *stab,double *best,double *bestDelta,
          double max,UpdateVector<double> *update,VectorBase<double> *lowBound,
          VectorBase<double> *upBound,int start,int incr)

{
  double *pdVar1;
  Type TVar2;
  int iVar3;
  uint uVar4;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  SPxSolverBase<double> *pSVar8;
  SPxId *pSVar9;
  ulong uVar10;
  int iVar11;
  pointer pdVar12;
  pointer pdVar13;
  uint *puVar14;
  bool bVar15;
  double dVar16;
  uint local_b4;
  uint local_b0;
  DataKey local_50;
  double local_48;
  undefined8 uStack_40;
  
  TVar2 = (this->super_SPxRatioTester<double>).m_type;
  if (TVar2 == LEAVE) {
    bVar15 = false;
  }
  else {
    bVar15 = ((this->super_SPxRatioTester<double>).thesolver)->theRep == ROW;
  }
  pdVar13 = (upBound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (lowBound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar5 = (update->super_VectorBase<double>).val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar6 = (update->thedelta).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar3 = (update->thedelta).super_IdxSet.num;
  local_b0 = 0xffffffff;
  local_b4 = 0xffffffff;
  if (start < iVar3) {
    piVar7 = (update->thedelta).super_IdxSet.idx;
    puVar14 = (uint *)(piVar7 + start);
    local_b4 = 0xffffffff;
    local_b0 = 0xffffffff;
    do {
      uVar4 = *puVar14;
      local_48 = pdVar6[(int)uVar4];
      if (TVar2 == LEAVE) {
        if (this->iscoid == true) {
          pSVar8 = (this->super_SPxRatioTester<double>).thesolver;
          iVar11 = pSVar8->theRep *
                   ((pSVar8->super_SPxBasisBase<double>).thedesc.costat)->data[(int)uVar4];
        }
        else {
          pSVar8 = (this->super_SPxRatioTester<double>).thesolver;
          iVar11 = pSVar8->theRep *
                   ((pSVar8->super_SPxBasisBase<double>).thedesc.stat)->data[(int)uVar4];
        }
        if (iVar11 < 1) goto LAB_00216303;
      }
      else {
LAB_00216303:
        if (bVar15) {
          pSVar8 = (this->super_SPxRatioTester<double>).thesolver;
          pSVar9 = (pSVar8->super_SPxBasisBase<double>).theBaseId.data;
          if (0 < pSVar9[(int)uVar4].super_DataKey.info) {
            uStack_40 = 0;
            SPxColId::SPxColId((SPxColId *)&local_50,pSVar9 + (int)uVar4);
            iVar11 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                               (&(pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.
                                 super_SVSetBase<double>.set,&local_50);
            if ((pSVar8->super_SPxBasisBase<double>).thedesc.colstat.data[iVar11] == P_FIXED)
            goto LAB_00216415;
          }
        }
        if (local_48 <= *stab) {
          if (local_48 < -*stab) {
            dVar16 = (pdVar13[(int)uVar4] - pdVar5[(int)uVar4]) / local_48;
            if (dVar16 < max) goto LAB_002163e5;
            *val = dVar16;
            *stab = -local_48;
            local_b0 = uVar4;
          }
        }
        else {
          dVar16 = (pdVar12[(int)uVar4] - pdVar5[(int)uVar4]) / local_48;
          if (dVar16 < max) {
LAB_002163e5:
            if (dVar16 < *best) {
              *best = dVar16;
              local_b4 = uVar4;
            }
          }
          else {
            *val = dVar16;
            *stab = local_48;
            local_b0 = uVar4;
          }
        }
      }
LAB_00216415:
      puVar14 = puVar14 + incr;
    } while (puVar14 < piVar7 + iVar3);
  }
  if (0 < (int)local_b4 && (int)local_b0 < 0) {
    uVar10 = (ulong)local_b4;
    pdVar1 = pdVar6 + uVar10;
    if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
      pdVar13 = pdVar5;
    }
    if (!NAN(*pdVar1) && (0.0 >= *pdVar1 && *pdVar1 != 0.0)) {
      pdVar12 = pdVar5;
    }
    *bestDelta = pdVar13[uVar10] - pdVar12[uVar10];
  }
  return local_b0;
}

Assistant:

int SPxFastRT<R>::minSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y >= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y < best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y >= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y < best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] < 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}